

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O2

void bifstrlwr(uchar *str,int len)

{
  byte bVar1;
  ushort **ppuVar2;
  __int32_t **pp_Var3;
  
  for (; len != 0; len = len + -1) {
    bVar1 = *str;
    if ((len < 2) || (bVar1 != 0x5c)) {
      ppuVar2 = __ctype_b_loc();
      if ((*(byte *)((long)*ppuVar2 + (ulong)bVar1 * 2 + 1) & 1) != 0) {
        pp_Var3 = __ctype_tolower_loc();
        *str = *(byte *)(*pp_Var3 + bVar1);
      }
    }
    else {
      len = len + -1;
      str = str + 1;
    }
    str = str + 1;
  }
  return;
}

Assistant:

static void bifstrlwr(uchar *str, int len)
{
    for ( ; len ; --len, ++str)
    {
        if (*str == '\\' && len > 1)
            --len, ++str;
        else if (isupper(*str))
            *str = tolower(*str);
    }
}